

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void Input::handleMousePosition(GLFWwindow *window,double xpos,double ypos)

{
  Input *pIVar1;
  
  if (instance == (Input *)0x0) {
    pIVar1 = (Input *)operator_new(0x440);
    pIVar1->mouseX = 0.0;
    pIVar1->mouseY = 0.0;
    memset(pIVar1,0,0x429);
    instance = pIVar1;
  }
  pIVar1 = instance;
  instance->mouseX = (float)xpos;
  if (pIVar1 == (Input *)0x0) {
    pIVar1 = (Input *)operator_new(0x440);
    pIVar1->mouseX = 0.0;
    pIVar1->mouseY = 0.0;
    memset(pIVar1,0,0x429);
    instance = pIVar1;
  }
  instance->mouseY = (float)ypos;
  return;
}

Assistant:

void Input::handleMousePosition(GLFWwindow * window, double xpos, double ypos)
{
	Input::getInstance()->mouseX = (float)xpos;
	Input::getInstance()->mouseY = (float)ypos;
}